

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageHandler.cpp
# Opt level: O3

void __thiscall MessageHandler::handleNotification(MessageHandler *this,Document *message)

{
  Type this_00;
  Ch *method;
  optional<NotificationHandler_*> oVar1;
  optional<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  params;
  string local_60;
  optional<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  local_40;
  
  this_00 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator[]<char_const>
                      ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        *)message,"method");
  method = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(this_00);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"params","");
  getObject(&local_40,message,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  oVar1 = HandlerManager::getNotificationHandler(this->handlers,method);
  if (((undefined1  [16])oVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    (*((oVar1.value)->super_Handler)._vptr_Handler[1])(oVar1.value,&local_40);
  }
  return;
}

Assistant:

void MessageHandler::handleNotification (Document &message) {
    const char *method = message["method"].GetString();

    optional<Value> params = getObject(message, "params");

    optional<NotificationHandler *> handler = handlers->getNotificationHandler(method);

    if (handler) {
        (*handler)->run(params);
    } else {
//        Not handling a notification is hardly exceptional
//        std::cerr << "Unhandled notification " << method << "\n";
    }
}